

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  char *pcVar2;
  TestNode *pTVar3;
  char *pcVar4;
  AttributeCase *pAVar5;
  DefaultVertexAttributeTests *pDVar6;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  TestNode *local_d8;
  TestCaseGroup *group_2;
  int targetNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  TestNode *local_88;
  TestCaseGroup *group_1;
  byte local_76;
  undefined1 local_75;
  int targetNdx_1;
  bool fullSet;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  TestNode *local_20;
  TestCaseGroup *group;
  DefaultVertexAttributeTests *pDStack_10;
  int targetNdx;
  DefaultVertexAttributeTests *this_local;
  
  group._4_4_ = 0;
  pDVar6 = this;
  pDStack_10 = this;
  while ((int)group._4_4_ < 0xd) {
    pTVar3 = (TestNode *)operator_new(0x70);
    local_75 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar2 = init::floatTargets[(int)group._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"test with ",&local_61);
    std::operator+(&local_40,&local_60,init::floatTargets[(int)group._4_4_].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar1,pcVar2,pcVar4);
    local_75 = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    local_76 = (init::floatTargets[(int)group._4_4_].reducedTestSets ^ 0xffU) & 1;
    local_20 = pTVar3;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1f>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    pTVar3 = local_20;
    if ((local_76 & 1) != 0) {
      pAVar5 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib2f>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    }
    pTVar3 = local_20;
    if ((local_76 & 1) != 0) {
      pAVar5 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib3f>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    }
    pTVar3 = local_20;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    pTVar3 = local_20;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    pTVar3 = local_20;
    if ((local_76 & 1) != 0) {
      pAVar5 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib2fv>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    }
    pTVar3 = local_20;
    if ((local_76 & 1) != 0) {
      pAVar5 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib3fv>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    }
    pTVar3 = local_20;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4fv>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    tcu::TestNode::addChild((TestNode *)this,local_20);
    group._4_4_ = group._4_4_ + 1;
    pDVar6 = (DefaultVertexAttributeTests *)(ulong)group._4_4_;
  }
  group_1._4_4_ = 0;
  while ((int)group_1._4_4_ < 4) {
    pTVar3 = (TestNode *)operator_new(0x70);
    group_2._6_1_ = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar2 = init::intTargets[(int)group_1._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetNdx_2,"test with ",(allocator<char> *)((long)&group_2 + 7));
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targetNdx_2
                   ,init::intTargets[(int)group_1._4_4_].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar1,pcVar2,pcVar4);
    group_2._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&targetNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&group_2 + 7));
    local_88 = pTVar3;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttribI4i>
                       ((this->super_TestCaseGroup).m_context,
                        init::intTargets[(int)group_1._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    pTVar3 = local_88;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttribI4iv>
                       ((this->super_TestCaseGroup).m_context,
                        init::intTargets[(int)group_1._4_4_].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    tcu::TestNode::addChild((TestNode *)this,local_88);
    group_1._4_4_ = group_1._4_4_ + 1;
    pDVar6 = (DefaultVertexAttributeTests *)(ulong)group_1._4_4_;
  }
  group_2._0_4_ = 0;
  while ((int)(uint)group_2 < 4) {
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar2 = init::uintTargets[(int)(uint)group_2].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"test with ",&local_119)
    ;
    std::operator+(&local_f8,&local_118,init::uintTargets[(int)(uint)group_2].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar1,pcVar2,pcVar4);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    local_d8 = pTVar3;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttribI4ui>
                       ((this->super_TestCaseGroup).m_context,
                        init::uintTargets[(int)(uint)group_2].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    pTVar3 = local_d8;
    pAVar5 = anon_unknown_1::AttributeCase::
             create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttribI4uiv>
                       ((this->super_TestCaseGroup).m_context,
                        init::uintTargets[(int)(uint)group_2].dataType);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pAVar5);
    tcu::TestNode::addChild((TestNode *)this,local_d8);
    group_2._0_4_ = (uint)group_2 + 1;
    pDVar6 = (DefaultVertexAttributeTests *)(ulong)(uint)group_2;
  }
  return (int)pDVar6;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat2x3",	glu::TYPE_FLOAT_MAT2X3,	true	},
		{ "mat2x4",	glu::TYPE_FLOAT_MAT2X4,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat3x2",	glu::TYPE_FLOAT_MAT3X2,	true	},
		{ "mat3x4",	glu::TYPE_FLOAT_MAT3X4,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
		{ "mat4x2",	glu::TYPE_FLOAT_MAT4X2,	true	},
		{ "mat4x3",	glu::TYPE_FLOAT_MAT4X3,	true	},
	};

	static const Target intTargets[] =
	{
		{ "int",	glu::TYPE_INT,			false	},
		{ "ivec2",	glu::TYPE_INT_VEC2,		true	},
		{ "ivec3",	glu::TYPE_INT_VEC3,		true	},
		{ "ivec4",	glu::TYPE_INT_VEC4,		false	},
	};

	static const Target uintTargets[] =
	{
		{ "uint",	glu::TYPE_UINT,			false	},
		{ "uvec2",	glu::TYPE_UINT_VEC2,	true	},
		{ "uvec3",	glu::TYPE_UINT_VEC3,	true	},
		{ "uvec4",	glu::TYPE_UINT_VEC4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}

	// int targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(intTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, intTargets[targetNdx].name, (std::string("test with ") + intTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, intTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4i);
		ADD_CASE		(LoaderVertexAttribI4iv);

#undef ADD_CASE

		addChild(group);
	}

	// uint targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(uintTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, uintTargets[targetNdx].name, (std::string("test with ") + uintTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, uintTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4ui);
		ADD_CASE		(LoaderVertexAttribI4uiv);

#undef ADD_CASE

		addChild(group);
	}
}